

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall
cfd::core::Psbt::SetTxInRecord(Psbt *this,uint32_t index,ByteData *key,ByteData *value)

{
  bool bVar1;
  CfdException *pCVar2;
  allocator local_101;
  string local_100;
  CfdSourceLocation local_e0;
  int local_c4;
  long lStack_c0;
  int ret;
  wally_map *map_ptr;
  undefined1 local_b0 [7];
  uint8_t type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> val_vec;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_vec;
  allocator local_69;
  string local_68;
  CfdSourceLocation local_48;
  void *local_30;
  wally_psbt *psbt_pointer;
  ByteData *value_local;
  ByteData *key_local;
  Psbt *pPStack_10;
  uint32_t index_local;
  Psbt *this_local;
  
  psbt_pointer = (wally_psbt *)value;
  value_local = key;
  key_local._4_4_ = index;
  pPStack_10 = this;
  (*this->_vptr_Psbt[2])(this,(ulong)index,0x9dd,"SetTxInRecord");
  local_30 = this->wally_psbt_pointer_;
  bVar1 = ByteData::IsEmpty(value_local);
  if (bVar1) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0x9e1;
    local_48.funcname = "SetTxInRecord";
    logger::warn<>(&local_48,"psbt empty key error.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_68,"psbt empty key error.",&local_69);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_68);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,value_local);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,
                     (ByteData *)psbt_pointer);
  map_ptr._7_1_ =
       SetPsbtInput((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    &val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,
                    (wally_psbt_input *)
                    (*(long *)((long)local_30 + 0x10) + (ulong)key_local._4_4_ * 0x110));
  lStack_c0 = 0;
  if (map_ptr._7_1_ < 9) {
    if (map_ptr._7_1_ == 2) {
      lStack_c0 = *(long *)((long)local_30 + 0x10) + (ulong)key_local._4_4_ * 0x110 + 0x60;
    }
    else if (map_ptr._7_1_ == 6) {
      lStack_c0 = *(long *)((long)local_30 + 0x10) + (ulong)key_local._4_4_ * 0x110 + 0x48;
    }
  }
  else {
    lStack_c0 = *(long *)((long)local_30 + 0x10) + (ulong)key_local._4_4_ * 0x110 + 0x78;
  }
  if (lStack_c0 != 0) {
    local_c4 = wally_map_sort(lStack_c0,0);
    if (local_c4 != 0) {
      local_e0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_e0.filename = local_e0.filename + 1;
      local_e0.line = 0x9f6;
      local_e0.funcname = "SetTxInRecord";
      logger::warn<int&>(&local_e0,"wally_map_sort NG[{}]",&local_c4);
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_100,"psbt input sort unknowns error.",&local_101);
      CfdException::CfdException(pCVar2,kCfdInternalError,&local_100);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_c4 = 0;
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Psbt::SetTxInRecord(
    uint32_t index, const ByteData &key, const ByteData &value) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (key.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "psbt empty key error.");
    throw CfdException(kCfdIllegalArgumentError, "psbt empty key error.");
  }

  auto key_vec = key.GetBytes();
  auto val_vec = value.GetBytes();
  uint8_t type = SetPsbtInput(key_vec, val_vec, &psbt_pointer->inputs[index]);

  struct wally_map *map_ptr = nullptr;
  if (type <= Psbt::kPsbtInputFinalScriptWitness) {
    if (type == Psbt::kPsbtInputPartialSig) {
      map_ptr = &psbt_pointer->inputs[index].signatures;
    } else if (type == Psbt::kPsbtInputBip32Derivation) {
      map_ptr = &psbt_pointer->inputs[index].keypaths;
    }
  } else {
    map_ptr = &psbt_pointer->inputs[index].unknowns;
  }
  if (map_ptr != nullptr) {
    int ret = wally_map_sort(map_ptr, 0);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
      throw CfdException(kCfdInternalError, "psbt input sort unknowns error.");
    }
  }
}